

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O2

Node * __thiscall
icu_63::StringTrieBuilder::makeBranchSubNode
          (StringTrieBuilder *this,int32_t start,int32_t limit,int32_t unitIndex,int32_t length,
          UErrorCode *errorCode)

{
  int iVar1;
  uint uVar2;
  uint limit_00;
  int iVar3;
  int iVar4;
  Node *pNVar5;
  ListBranchNode *this_00;
  undefined4 in_register_0000000c;
  int32_t length_00;
  int iVar6;
  undefined4 in_register_00000034;
  size_t size;
  ulong uVar7;
  long local_d8;
  UChar middleUnits [14];
  Node *lessThan [14];
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    local_d8 = 0;
    size = CONCAT44(in_register_00000034,start);
    uVar7 = (ulong)(uint)start;
    for (; iVar1 = (*(this->super_UObject)._vptr_UObject[0xb])(this), iVar1 < length;
        length = length - length_00) {
      length_00 = (int32_t)((long)length / 2);
      uVar2 = (*(this->super_UObject)._vptr_UObject[8])
                        (this,uVar7,unitIndex,(long)length / 2 & 0xffffffff);
      iVar1 = (*(this->super_UObject)._vptr_UObject[4])(this,(ulong)uVar2,unitIndex);
      middleUnits[local_d8] = (UChar)iVar1;
      pNVar5 = makeBranchSubNode(this,(int32_t)uVar7,uVar2,unitIndex,length_00,errorCode);
      lessThan[local_d8] = pNVar5;
      local_d8 = local_d8 + 1;
      size = uVar7;
      uVar7 = (ulong)uVar2;
    }
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      this_00 = (ListBranchNode *)UMemory::operator_new((UMemory *)0x68,size);
      if (this_00 != (ListBranchNode *)0x0) {
        (this_00->super_BranchNode).super_Node.hash = 0x444444;
        (this_00->super_BranchNode).super_Node.offset = 0;
        (this_00->super_BranchNode).super_Node.super_UObject._vptr_UObject =
             (_func_int **)&PTR__UObject_003df188;
        this_00->length = 0;
        iVar1 = unitIndex + 1;
        iVar6 = 0;
        do {
          iVar4 = (int)uVar7;
          uVar2 = (*(this->super_UObject)._vptr_UObject[4])(this,uVar7,unitIndex);
          uVar2 = uVar2 & 0xffff;
          limit_00 = (*(this->super_UObject)._vptr_UObject[9])
                               (this,(ulong)(iVar4 + 1),unitIndex,(ulong)uVar2);
          if ((iVar4 == limit_00 - 1) &&
             (iVar3 = (*(this->super_UObject)._vptr_UObject[3])(this,uVar7), iVar1 == iVar3)) {
            iVar4 = (*(this->super_UObject)._vptr_UObject[5])(this,uVar7);
            ListBranchNode::add(this_00,uVar2,iVar4);
          }
          else {
            pNVar5 = makeNode(this,iVar4,limit_00,iVar1,errorCode);
            ListBranchNode::add(this_00,uVar2,pNVar5);
          }
          iVar6 = iVar6 + 1;
          uVar7 = (ulong)limit_00;
        } while (iVar6 < length + -1);
        uVar2 = (*(this->super_UObject)._vptr_UObject[4])
                          (this,(ulong)limit_00,CONCAT44(in_register_0000000c,unitIndex));
        if ((limit_00 == limit - 1U) &&
           (iVar6 = (*(this->super_UObject)._vptr_UObject[3])(this,(ulong)limit_00), iVar1 == iVar6)
           ) {
          iVar1 = (*(this->super_UObject)._vptr_UObject[5])(this,(ulong)limit_00);
          ListBranchNode::add(this_00,uVar2 & 0xffff,iVar1);
        }
        else {
          pNVar5 = makeNode(this,limit_00,limit,iVar1,errorCode);
          ListBranchNode::add(this_00,uVar2 & 0xffff,pNVar5);
        }
        pNVar5 = registerNode(this,(Node *)this_00,errorCode);
        for (; 0 < local_d8; local_d8 = local_d8 + -1) {
          this_00 = (ListBranchNode *)UMemory::operator_new((UMemory *)0x28,(size_t)this_00);
          if (this_00 != (ListBranchNode *)0x0) {
            SplitBranchNode::SplitBranchNode
                      ((SplitBranchNode *)this_00,middleUnits[local_d8 + -1],
                       *(Node **)(middleUnits + local_d8 * 4 + 0xc),pNVar5);
          }
          pNVar5 = registerNode(this,(Node *)this_00,errorCode);
        }
        return pNVar5;
      }
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
    }
  }
  return (Node *)0x0;
}

Assistant:

StringTrieBuilder::Node *
StringTrieBuilder::makeBranchSubNode(int32_t start, int32_t limit, int32_t unitIndex,
                                   int32_t length, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return NULL;
    }
    UChar middleUnits[kMaxSplitBranchLevels];
    Node *lessThan[kMaxSplitBranchLevels];
    int32_t ltLength=0;
    while(length>getMaxBranchLinearSubNodeLength()) {
        // Branch on the middle unit.
        // First, find the middle unit.
        int32_t i=skipElementsBySomeUnits(start, unitIndex, length/2);
        // Create the less-than branch.
        middleUnits[ltLength]=getElementUnit(i, unitIndex);  // middle unit
        lessThan[ltLength]=makeBranchSubNode(start, i, unitIndex, length/2, errorCode);
        ++ltLength;
        // Continue for the greater-or-equal branch.
        start=i;
        length=length-length/2;
    }
    if(U_FAILURE(errorCode)) {
        return NULL;
    }
    ListBranchNode *listNode=new ListBranchNode();
    if(listNode==NULL) {
        errorCode=U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }
    // For each unit, find its elements array start and whether it has a final value.
    int32_t unitNumber=0;
    do {
        int32_t i=start;
        UChar unit=getElementUnit(i++, unitIndex);
        i=indexOfElementWithNextUnit(i, unitIndex, unit);
        if(start==i-1 && unitIndex+1==getElementStringLength(start)) {
            listNode->add(unit, getElementValue(start));
        } else {
            listNode->add(unit, makeNode(start, i, unitIndex+1, errorCode));
        }
        start=i;
    } while(++unitNumber<length-1);
    // unitNumber==length-1, and the maxUnit elements range is [start..limit[
    UChar unit=getElementUnit(start, unitIndex);
    if(start==limit-1 && unitIndex+1==getElementStringLength(start)) {
        listNode->add(unit, getElementValue(start));
    } else {
        listNode->add(unit, makeNode(start, limit, unitIndex+1, errorCode));
    }
    Node *node=registerNode(listNode, errorCode);
    // Create the split-branch nodes.
    while(ltLength>0) {
        --ltLength;
        node=registerNode(
            new SplitBranchNode(middleUnits[ltLength], lessThan[ltLength], node), errorCode);
    }
    return node;
}